

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::internal::check_sign<char>(char **s,Arg *arg)

{
  Type TVar1;
  runtime_error *prVar2;
  char sign;
  string message;
  char local_3a;
  char local_39;
  string local_38;
  
  local_3a = **s;
  TVar1 = arg->type;
  local_39 = local_3a;
  if (9 < (int)TVar1) {
    format<char>(&local_38,(CStringRef)0x26bd17,&local_39);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,local_38._M_dataplus._M_p);
    *(undefined ***)prVar2 = &PTR__FormatError_002fdca8;
    __cxa_throw(prVar2,&FormatError::typeinfo,FormatError::~FormatError);
  }
  if ((TVar1 != ULONG_LONG) && (TVar1 != UINT)) {
    *s = *s + 1;
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  format<char>(&local_38,(CStringRef)0x26bd47,&local_3a);
  std::runtime_error::runtime_error(prVar2,local_38._M_dataplus._M_p);
  *(undefined ***)prVar2 = &PTR__FormatError_002fdca8;
  __cxa_throw(prVar2,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void check_sign(const Char *&s, const Arg &arg) {
  char sign = static_cast<char>(*s);
  require_numeric_argument(arg, sign);
  if (arg.type == Arg::UINT || arg.type == Arg::ULONG_LONG) {
    FMT_THROW(FormatError(fmt::format(
      "format specifier '{}' requires signed argument", sign)));
  }
  ++s;
}